

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fc_layer.h
# Opt level: O1

void __thiscall fc_layer_t::fix_weights(fc_layer_t *this)

{
  float fVar1;
  pointer pgVar2;
  undefined1 auVar3 [16];
  int _x;
  float *pfVar4;
  float *pfVar5;
  int _y;
  long lVar6;
  int _z;
  
  if (0 < (this->super_layer_t).out.size.x) {
    lVar6 = 0;
    do {
      pgVar2 = (this->gradients).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (0 < (this->super_layer_t).in.size.x) {
        _x = 0;
        do {
          if (0 < (this->super_layer_t).in.size.y) {
            _y = 0;
            do {
              if (0 < (this->super_layer_t).in.size.z) {
                _z = 0;
                do {
                  pfVar4 = tensor_t<float>::get
                                     (&this->weights,
                                      ((this->super_layer_t).in.size.y * _z + _y) *
                                      (this->super_layer_t).in.size.x + _x,(int)lVar6,0);
                  fVar1 = *pfVar4;
                  pfVar5 = tensor_t<float>::get(&(this->super_layer_t).in,_x,_y,_z);
                  auVar3 = vfmadd213ss_fma(ZEXT416((uint)pgVar2[lVar6].oldgrad),
                                           SUB6416(ZEXT464(0x3f19999a),0),
                                           ZEXT416((uint)pgVar2[lVar6].grad));
                  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(*pfVar5 * -0.01 * auVar3._0_4_)),
                                           SUB6416(ZEXT464(0x3f7fff58),0),ZEXT416((uint)fVar1));
                  *pfVar4 = auVar3._0_4_;
                  _z = _z + 1;
                } while (_z < (this->super_layer_t).in.size.z);
              }
              _y = _y + 1;
            } while (_y < (this->super_layer_t).in.size.y);
          }
          _x = _x + 1;
        } while (_x < (this->super_layer_t).in.size.x);
      }
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)pgVar2[lVar6].oldgrad),SUB6416(ZEXT464(0x3f19999a),0),
                               ZEXT416((uint)pgVar2[lVar6].grad));
      pgVar2[lVar6].oldgrad = auVar3._0_4_;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->super_layer_t).out.size.x);
  }
  return;
}

Assistant:

void fix_weights() {
    for (int n = 0; n < out.size.x; n++) {
      gradient_t &grad = gradients[n];
      for (int i = 0; i < in.size.x; i++)
        for (int j = 0; j < in.size.y; j++)
          for (int z = 0; z < in.size.z; z++) {
            int m = map({i, j, z});
            float &w = weights(m, n, 0);
            w = update_weight(w, grad, in(i, j, z));
          }

      update_gradient(grad);
    }
  }